

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

bool __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::nextIteration(MemoryTestInstance *this)

{
  MemoryTestInstance *this_local;
  
  this->m_iteration = this->m_iteration + 1;
  if (this->m_iteration < this->m_iterationCount) {
    resetResources(this);
    this->m_stage = (StageFunc)createCommandsAndAllocateMemory;
    *(undefined8 *)&this->field_0x258 = 0;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = nextMemoryType(this);
  }
  return this_local._7_1_;
}

Assistant:

bool MemoryTestInstance::nextIteration (void)
{
	m_iteration++;

	if (m_iteration < m_iterationCount)
	{
		resetResources();
		m_stage = &MemoryTestInstance::createCommandsAndAllocateMemory;
		return true;
	}
	else
		return nextMemoryType();
}